

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *this_00;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar4;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> xs;
  AssertHelper local_610;
  Message local_608;
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_600;
  iterator local_5e8;
  iterator ppStack_5e0;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>
  local_5d0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_5b0;
  undefined1 local_590 [8];
  AssertionResult gtest_ar;
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> local_570;
  StatefulTestingEqual local_568;
  StatefulTestingHash local_560;
  iterator local_558;
  size_type sStack_550;
  undefined1 local_548 [8];
  TypeParam m;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_78;
  EnumClass local_68;
  int local_60;
  EnumClass local_58;
  int local_50;
  EnumClass local_48;
  int local_40;
  EnumClass local_38;
  int local_30;
  iterator ppStack_28;
  initializer_list<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> values;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> gen;
  AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>
  *matcher;
  
  this_00 = (Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *)
            ((long)&values._M_len + 7);
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_78.first = pVar4.first;
  local_78.second = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_68 = pVar4.first;
  local_60 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_58 = pVar4.first;
  local_50 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  local_48 = pVar4.first;
  local_40 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (this_00);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = pVar4.first;
  local_30 = pVar4.second;
  local_558 = &local_78;
  values._M_array = (iterator)0x5;
  sStack_550 = 5;
  local_560.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  local_38 = m.
             super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .sets_._M_elems[0xf].set_.settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  ppStack_28 = local_558;
  StatefulTestingHash::StatefulTestingHash(&local_560);
  local_568.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_568);
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::Alloc(&local_570,0);
  sVar3 = 0;
  iVar1._M_len = sStack_550;
  iVar1._M_array = local_558;
  parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
                       *)local_548,iVar1,0,&local_560,&local_568,&local_570);
  Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::~Alloc(&local_570);
  parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  ::operator=((parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
               *)local_548,
              (parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
               *)local_548);
  local_5e8 = ppStack_28;
  ppStack_5e0 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  testing::UnorderedElementsAreArray<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            (&local_5d0,(testing *)ppStack_28,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
            (&local_5b0,(internal *)&local_5d0,matcher);
  items<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>>
            (&local_600,(priv *)local_548,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::operator()(local_590,(char *)&local_5b0,
               (vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~vector(&local_600);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_5b0);
  testing::internal::
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_5d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar2) {
    testing::Message::Message(&local_608);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1db,message);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_node_hash_map
            ((parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
              *)local_548);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}